

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O2

int32_t icu_63::FixedDecimal::decimals(double n)

{
  int iVar1;
  int ndigits;
  ulong uVar2;
  long lVar3;
  int *piVar4;
  double __x;
  double dVar5;
  char buf [30];
  char local_38 [40];
  
  piVar4 = &p10;
  for (uVar2 = 0; uVar2 != 4; uVar2 = uVar2 + 1) {
    __x = (double)*piVar4 * ABS(n);
    dVar5 = floor(__x);
    if ((__x == dVar5) && (!NAN(__x) && !NAN(dVar5))) goto LAB_0026d496;
    piVar4 = piVar4 + 1;
  }
  local_38[0x10] = '\0';
  local_38[0x11] = '\0';
  local_38[0x12] = '\0';
  local_38[0x13] = '\0';
  local_38[0x14] = '\0';
  local_38[0x15] = '\0';
  local_38[0x16] = '\0';
  local_38[0x17] = '\0';
  local_38[0x18] = '\0';
  local_38[0x19] = '\0';
  local_38[0x1a] = '\0';
  local_38[0x1b] = '\0';
  local_38[0x1c] = '\0';
  local_38[0x1d] = '\0';
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '\0';
  local_38[8] = '\0';
  local_38[9] = '\0';
  local_38[10] = '\0';
  local_38[0xb] = '\0';
  local_38[0xc] = '\0';
  local_38[0xd] = '\0';
  local_38[0xe] = '\0';
  local_38[0xf] = '\0';
  sprintf(local_38,"%1.15e",ABS(n));
  iVar1 = atoi(local_38 + 0x12);
  for (lVar3 = 0; local_38[lVar3 + 0x10] == '0'; lVar3 = lVar3 + -1) {
  }
  uVar2 = (ulong)(((int)lVar3 - iVar1) + 0xf);
LAB_0026d496:
  return (int32_t)uVar2;
}

Assistant:

int32_t FixedDecimal::decimals(double n) {
    // Count the number of decimal digits in the fraction part of the number, excluding trailing zeros.
    // fastpath the common cases, integers or fractions with 3 or fewer digits
    n = fabs(n);
    for (int ndigits=0; ndigits<=3; ndigits++) {
        double scaledN = n * p10[ndigits];
        if (scaledN == floor(scaledN)) {
            return ndigits;
        }
    }

    // Slow path, convert with sprintf, parse converted output.
    char  buf[30] = {0};
    sprintf(buf, "%1.15e", n);
    // formatted number looks like this: 1.234567890123457e-01
    int exponent = atoi(buf+18);
    int numFractionDigits = 15;
    for (int i=16; ; --i) {
        if (buf[i] != '0') {
            break;
        }
        --numFractionDigits;
    }
    numFractionDigits -= exponent;   // Fraction part of fixed point representation.
    return numFractionDigits;
}